

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

shared_ptr<const_SyntaxTree> hint_from(optional<const_SyntaxTree_&> *cmdnode,value_type *arg)

{
  bool bVar1;
  undefined7 extraout_var;
  element_type *extraout_RAX;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_const_SyntaxTree_*,_int,_float>,_true,_true>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  anon_union_8_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_const_SyntaxTree_*,_int,_float>,_true>_3
  __r;
  shared_ptr<const_SyntaxTree> sVar4;
  anon_class_1_0_00000001 local_19;
  element_type *peVar2;
  
  bVar1 = eggs::variants::detail::
          apply<bool,is<SyntaxTree_const*,eggs::variants::variant<SyntaxTree_const*,int,float>>(eggs::variants::variant<SyntaxTree_const*,int,float>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,SyntaxTree_const*,int,float>,true,true>const&>
                    (&local_19,in_RDX);
  peVar2 = (element_type *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    if (in_RDX->_which != 1) {
      eggs::variants::detail::throw_bad_variant_access<SyntaxTree_const*const&>();
    }
    __r = (in_RDX->
          super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_const_SyntaxTree_*,_int,_float>,_true>
          ).field_0;
  }
  else {
    __r = (arg->_storage).
          super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_const_SyntaxTree_*,_int,_float>,_true>
          .field_0;
    if (__r == (anon_union_8_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_const_SyntaxTree_*,_int,_float>,_true>_3
                )0x0) {
      cmdnode->ref = (SyntaxTree *)0x0;
      cmdnode[1].ref = (SyntaxTree *)0x0;
      _Var3._M_pi = extraout_RDX;
      goto LAB_00163388;
    }
  }
  std::__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
            ((__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2> *)cmdnode,
             (__weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)__r);
  peVar2 = extraout_RAX;
  _Var3._M_pi = extraout_RDX_00;
LAB_00163388:
  sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (shared_ptr<const_SyntaxTree>)
         sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto hint_from(optional<const SyntaxTree&> cmdnode, const Commands::MatchArgumentList::value_type& arg) -> shared_ptr<const SyntaxTree>
{
    if(is<const SyntaxTree*>(arg))
        return get<const SyntaxTree*>(arg)->shared_from_this();
    return hint_from(cmdnode);
}